

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

void __thiscall
dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>>::emplace<dg::vr::Bucket&>
          (VectorSet<std::reference_wrapper<dg::vr::Bucket>> *this,Bucket *vals)

{
  bool bVar1;
  reference_wrapper<dg::vr::Bucket> val;
  reference_wrapper<dg::vr::Bucket> local_10;
  
  local_10._M_data = vals;
  bVar1 = contains<std::reference_wrapper<dg::vr::Bucket>>(this,&local_10);
  if (!bVar1) {
    std::
    vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
    ::emplace_back<std::reference_wrapper<dg::vr::Bucket>>
              ((vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
                *)this,&local_10);
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }